

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::NullTypeHandlerBase::HasProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,JavascriptString *propertyNameString)

{
  BOOL BVar1;
  PropertyRecord *in_RAX;
  PropertyValueInfo *in_R8;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = in_RAX;
  ScriptContext::GetOrAddPropertyRecord
            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_28);
  BVar1 = HasProperty(this,instance,local_28->pid,(bool *)0x0,in_R8);
  return BVar1;
}

Assistant:

BOOL NullTypeHandlerBase::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return NullTypeHandlerBase::HasProperty(instance, propertyRecord->GetPropertyId());
    }